

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TOperator __thiscall glslang::TIntermediate::mapTypeToConstructorOp(TIntermediate *this,TType *type)

{
  int iVar1;
  TOperator TVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  uint uVar4;
  undefined *puVar5;
  bool bVar6;
  
  iVar1 = (*type->_vptr_TType[0xb])(type);
  if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0xc) & 2) != 0) {
    return EOpConstructNonuniform;
  }
  uVar4 = *(uint *)&type->field_0x8;
  if ((uVar4 >> 0x15 & 1) != 0) {
    return EOpConstructCooperativeMatrixNV;
  }
  if ((uVar4 >> 0x16 & 1) != 0) {
    return EOpConstructCooperativeMatrixKHR;
  }
  if ((uVar4 >> 0x1b & 1) != 0) {
    return EOpConstructCooperativeVectorNV;
  }
  iVar1 = (*type->_vptr_TType[7])(type);
  TVar2 = EOpNull;
  switch(iVar1) {
  case 1:
    iVar1 = (*type->_vptr_TType[0x1c])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = (*type->_vptr_TType[0xc])(type);
      if (3 < iVar1 - 1U) {
        return EOpNull;
      }
      uVar3 = (ulong)(iVar1 - 1U);
      puVar5 = &DAT_0063b240;
      goto LAB_0038de6c;
    }
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 4) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructMat3x3;
    }
    else if (iVar1 == 3) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructMat2x3;
    }
    else {
      if (iVar1 != 2) {
        return EOpNull;
      }
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructVec3;
    }
    break;
  case 2:
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 0) {
      iVar1 = (*type->_vptr_TType[0xc])(type);
      if (3 < iVar1 - 1U) {
        return EOpNull;
      }
      uVar3 = (ulong)(iVar1 - 1U);
      puVar5 = &DAT_0063b280;
      goto LAB_0038de6c;
    }
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 4) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructDMat3x3;
    }
    else if (iVar1 == 3) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructDMat2x3;
    }
    else {
      if (iVar1 != 2) {
        return EOpNull;
      }
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructU64Vec3;
    }
    break;
  case 3:
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 0) {
      iVar1 = (*type->_vptr_TType[0xc])(type);
      TVar2 = iVar1 + EOpConstructBMat4x4;
      bVar6 = iVar1 - 1U < 4;
      goto LAB_0038df6a;
    }
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 4) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructF16Mat3x3;
    }
    else if (iVar1 == 3) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructF16Mat2x3;
    }
    else {
      if (iVar1 != 2) {
        return EOpNull;
      }
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructF16Vec3;
    }
    break;
  case 4:
    iVar1 = (*type->_vptr_TType[0xc])(type);
    if (3 < iVar1 - 1U) {
      return EOpNull;
    }
    uVar3 = (ulong)(iVar1 - 1U);
    puVar5 = &DAT_0063b290;
    goto LAB_0038de6c;
  case 5:
    iVar1 = (*type->_vptr_TType[0xc])(type);
    if (3 < iVar1 - 1U) {
      return EOpNull;
    }
    uVar3 = (ulong)(iVar1 - 1U);
    puVar5 = &DAT_0063b2a0;
    goto LAB_0038de6c;
  case 6:
    iVar1 = (*type->_vptr_TType[0xc])(type);
    if (3 < iVar1 - 1U) {
      return EOpNull;
    }
    uVar3 = (ulong)(iVar1 - 1U);
    puVar5 = &DAT_0063b2b0;
    goto LAB_0038de6c;
  case 7:
    iVar1 = (*type->_vptr_TType[0xc])(type);
    if (3 < iVar1 - 1U) {
      return EOpNull;
    }
    uVar3 = (ulong)(iVar1 - 1U);
    puVar5 = &DAT_0063b2c0;
    goto LAB_0038de6c;
  case 8:
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 0) {
      iVar1 = (*type->_vptr_TType[0xc])(type);
      if (3 < iVar1 - 1U) {
        return EOpNull;
      }
      uVar3 = (ulong)(iVar1 - 1U);
      puVar5 = &DAT_0063b250;
      goto LAB_0038de6c;
    }
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 4) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructIMat3x3;
    }
    else if (iVar1 == 3) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructIMat2x3;
    }
    else {
      if (iVar1 != 2) {
        return EOpNull;
      }
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructDMat4x3;
    }
    break;
  case 9:
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 0) {
      iVar1 = (*type->_vptr_TType[0xc])(type);
      if (3 < iVar1 - 1U) {
        return EOpNull;
      }
      uVar3 = (ulong)(iVar1 - 1U);
      puVar5 = &DAT_0063b260;
      goto LAB_0038de6c;
    }
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 4) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructUMat3x3;
    }
    else if (iVar1 == 3) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructUMat2x3;
    }
    else {
      if (iVar1 != 2) {
        return EOpNull;
      }
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructIMat4x3;
    }
    break;
  case 10:
    iVar1 = (*type->_vptr_TType[0xc])(type);
    if (3 < iVar1 - 1U) {
      return EOpNull;
    }
    uVar3 = (ulong)(iVar1 - 1U);
    puVar5 = &DAT_0063b2d0;
    goto LAB_0038de6c;
  case 0xb:
    iVar1 = (*type->_vptr_TType[0xc])(type);
    if (3 < iVar1 - 1U) {
      return EOpNull;
    }
    uVar3 = (ulong)(iVar1 - 1U);
    puVar5 = &DAT_0063b2e0;
LAB_0038de6c:
    TVar2 = *(TOperator *)(puVar5 + uVar3 * 4);
switchD_0038dafa_caseD_d:
    return TVar2;
  case 0xc:
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 0) {
      iVar1 = (*type->_vptr_TType[0xc])(type);
      if (3 < iVar1 - 1U) {
        return EOpNull;
      }
      uVar3 = (ulong)(iVar1 - 1U);
      puVar5 = &DAT_0063b270;
      goto LAB_0038de6c;
    }
    iVar1 = (*type->_vptr_TType[0xd])(type);
    if (iVar1 == 4) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructBMat3x3;
    }
    else if (iVar1 == 3) {
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructBMat2x3;
    }
    else {
      if (iVar1 != 2) {
        return EOpNull;
      }
      iVar1 = (*type->_vptr_TType[0xe])(type);
      uVar4 = iVar1 - 2;
      TVar2 = iVar1 + EOpConstructUMat4x3;
    }
    break;
  default:
    goto switchD_0038dafa_caseD_d;
  case 0xe:
    iVar1 = (*type->_vptr_TType[8])(type);
    return (*(int *)CONCAT44(extraout_var_00,iVar1) << 0xb) >> 0x1f & EOpConstructTextureSampler;
  case 0xf:
    return EOpConstructStruct;
  case 0x11:
    return EOpConstructAccStruct;
  case 0x12:
    TVar2 = EOpConstructReference;
    goto switchD_0038dafa_caseD_d;
  }
  bVar6 = uVar4 < 3;
LAB_0038df6a:
  if (!bVar6) {
    return EOpNull;
  }
  return TVar2;
}

Assistant:

TOperator TIntermediate::mapTypeToConstructorOp(const TType& type) const
{
    TOperator op = EOpNull;

    if (type.getQualifier().isNonUniform())
        return EOpConstructNonuniform;

    if (type.isCoopMatNV())
        return EOpConstructCooperativeMatrixNV;

    if (type.isCoopMatKHR())
        return EOpConstructCooperativeMatrixKHR;

    if (type.isCoopVecNV())
        return EOpConstructCooperativeVectorNV;

    switch (type.getBasicType()) {
    case EbtStruct:
        op = EOpConstructStruct;
        break;
    case EbtSampler:
        if (type.getSampler().isCombined())
            op = EOpConstructTextureSampler;
        break;
    case EbtFloat:
        if (type.isMatrix()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructMat2x2; break;
                case 3: op = EOpConstructMat2x3; break;
                case 4: op = EOpConstructMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructMat3x2; break;
                case 3: op = EOpConstructMat3x3; break;
                case 4: op = EOpConstructMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructMat4x2; break;
                case 3: op = EOpConstructMat4x3; break;
                case 4: op = EOpConstructMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            default: break; // some compilers want this
            }
        } else {
            switch(type.getVectorSize()) {
            case 1: op = EOpConstructFloat; break;
            case 2: op = EOpConstructVec2;  break;
            case 3: op = EOpConstructVec3;  break;
            case 4: op = EOpConstructVec4;  break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtInt:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructIMat2x2; break;
                case 3: op = EOpConstructIMat2x3; break;
                case 4: op = EOpConstructIMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructIMat3x2; break;
                case 3: op = EOpConstructIMat3x3; break;
                case 4: op = EOpConstructIMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructIMat4x2; break;
                case 3: op = EOpConstructIMat4x3; break;
                case 4: op = EOpConstructIMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        } else {
            switch(type.getVectorSize()) {
            case 1: op = EOpConstructInt;   break;
            case 2: op = EOpConstructIVec2; break;
            case 3: op = EOpConstructIVec3; break;
            case 4: op = EOpConstructIVec4; break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtUint:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructUMat2x2; break;
                case 3: op = EOpConstructUMat2x3; break;
                case 4: op = EOpConstructUMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructUMat3x2; break;
                case 3: op = EOpConstructUMat3x3; break;
                case 4: op = EOpConstructUMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructUMat4x2; break;
                case 3: op = EOpConstructUMat4x3; break;
                case 4: op = EOpConstructUMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        } else {
            switch(type.getVectorSize()) {
            case 1: op = EOpConstructUint;  break;
            case 2: op = EOpConstructUVec2; break;
            case 3: op = EOpConstructUVec3; break;
            case 4: op = EOpConstructUVec4; break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtBool:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructBMat2x2; break;
                case 3: op = EOpConstructBMat2x3; break;
                case 4: op = EOpConstructBMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructBMat3x2; break;
                case 3: op = EOpConstructBMat3x3; break;
                case 4: op = EOpConstructBMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructBMat4x2; break;
                case 3: op = EOpConstructBMat4x3; break;
                case 4: op = EOpConstructBMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        } else {
            switch(type.getVectorSize()) {
            case 1:  op = EOpConstructBool;  break;
            case 2:  op = EOpConstructBVec2; break;
            case 3:  op = EOpConstructBVec3; break;
            case 4:  op = EOpConstructBVec4; break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtDouble:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructDMat2x2; break;
                case 3: op = EOpConstructDMat2x3; break;
                case 4: op = EOpConstructDMat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructDMat3x2; break;
                case 3: op = EOpConstructDMat3x3; break;
                case 4: op = EOpConstructDMat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructDMat4x2; break;
                case 3: op = EOpConstructDMat4x3; break;
                case 4: op = EOpConstructDMat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        } else {
            switch(type.getVectorSize()) {
            case 1: op = EOpConstructDouble; break;
            case 2: op = EOpConstructDVec2;  break;
            case 3: op = EOpConstructDVec3;  break;
            case 4: op = EOpConstructDVec4;  break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtFloat16:
        if (type.getMatrixCols()) {
            switch (type.getMatrixCols()) {
            case 2:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructF16Mat2x2; break;
                case 3: op = EOpConstructF16Mat2x3; break;
                case 4: op = EOpConstructF16Mat2x4; break;
                default: break; // some compilers want this
                }
                break;
            case 3:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructF16Mat3x2; break;
                case 3: op = EOpConstructF16Mat3x3; break;
                case 4: op = EOpConstructF16Mat3x4; break;
                default: break; // some compilers want this
                }
                break;
            case 4:
                switch (type.getMatrixRows()) {
                case 2: op = EOpConstructF16Mat4x2; break;
                case 3: op = EOpConstructF16Mat4x3; break;
                case 4: op = EOpConstructF16Mat4x4; break;
                default: break; // some compilers want this
                }
                break;
            }
        }
        else {
            switch (type.getVectorSize()) {
            case 1: op = EOpConstructFloat16;  break;
            case 2: op = EOpConstructF16Vec2;  break;
            case 3: op = EOpConstructF16Vec3;  break;
            case 4: op = EOpConstructF16Vec4;  break;
            default: break; // some compilers want this
            }
        }
        break;
    case EbtInt8:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructInt8;   break;
        case 2: op = EOpConstructI8Vec2; break;
        case 3: op = EOpConstructI8Vec3; break;
        case 4: op = EOpConstructI8Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtUint8:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructUint8;  break;
        case 2: op = EOpConstructU8Vec2; break;
        case 3: op = EOpConstructU8Vec3; break;
        case 4: op = EOpConstructU8Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtInt16:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructInt16;   break;
        case 2: op = EOpConstructI16Vec2; break;
        case 3: op = EOpConstructI16Vec3; break;
        case 4: op = EOpConstructI16Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtUint16:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructUint16;  break;
        case 2: op = EOpConstructU16Vec2; break;
        case 3: op = EOpConstructU16Vec3; break;
        case 4: op = EOpConstructU16Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtInt64:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructInt64;   break;
        case 2: op = EOpConstructI64Vec2; break;
        case 3: op = EOpConstructI64Vec3; break;
        case 4: op = EOpConstructI64Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtUint64:
        switch(type.getVectorSize()) {
        case 1: op = EOpConstructUint64;  break;
        case 2: op = EOpConstructU64Vec2; break;
        case 3: op = EOpConstructU64Vec3; break;
        case 4: op = EOpConstructU64Vec4; break;
        default: break; // some compilers want this
        }
        break;
    case EbtReference:
        op = EOpConstructReference;
        break;

    case EbtAccStruct:
        op = EOpConstructAccStruct;
        break;
    default:
        break;
    }

    return op;
}